

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExplain::Deserialize(LogicalExplain *this,Deserializer *deserializer)

{
  ExplainType explain_type;
  LogicalExplain *this_00;
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalExplain_*,_false> local_28;
  
  explain_type = Deserializer::ReadProperty<duckdb::ExplainType>(deserializer,200,"explain_type");
  this_00 = (LogicalExplain *)operator_new(200);
  LogicalExplain(this_00,explain_type);
  local_28._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"physical_plan",&pLVar1->physical_plan);
  pLVar1 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xca,"logical_plan_unopt",&pLVar1->logical_plan_unopt);
  pLVar1 = unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>::
           operator->((unique_ptr<duckdb::LogicalExplain,_std::default_delete<duckdb::LogicalExplain>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xcb,"logical_plan_opt",&pLVar1->logical_plan_opt);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExplain::Deserialize(Deserializer &deserializer) {
	auto explain_type = deserializer.ReadProperty<ExplainType>(200, "explain_type");
	auto result = duckdb::unique_ptr<LogicalExplain>(new LogicalExplain(explain_type));
	deserializer.ReadPropertyWithDefault<string>(201, "physical_plan", result->physical_plan);
	deserializer.ReadPropertyWithDefault<string>(202, "logical_plan_unopt", result->logical_plan_unopt);
	deserializer.ReadPropertyWithDefault<string>(203, "logical_plan_opt", result->logical_plan_opt);
	return std::move(result);
}